

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CType *stm)

{
  bool bVar1;
  CError local_70;
  TypeInfo local_40;
  CType *local_18;
  CType *stm_local;
  CTypeCheckerVisitor *this_local;
  
  local_18 = stm;
  stm_local = (CType *)this;
  std::operator<<((ostream *)&std::cout,"typechecker: type\n");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->name);
  if (bVar1) {
    TypeInfo::TypeInfo(&local_40,VOID);
    TypeInfo::operator=(&this->lastCalculatedType,&local_40);
    TypeInfo::~TypeInfo(&local_40);
  }
  else {
    CError::CError(&local_70,(string *)CError::AST_ERROR_abi_cxx11_,
                   &(local_18->super_IWrapper).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_70);
    CError::~CError(&local_70);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CType &stm ) 
{
	std::cout << "typechecker: type\n";
    if( stm.name ) {
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}